

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O2

uint8_t * VP8DecompressAlphaRows(VP8Decoder *dec,VP8Io *io,int row,int num_rows)

{
  byte bVar1;
  int stride;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ALPHDecoder *pAVar7;
  uint8_t *puVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  size_t __n;
  int iVar13;
  long lVar14;
  uint8_t *puVar15;
  bool bVar16;
  
  iVar6 = io->crop_bottom;
  if (iVar6 < num_rows + row || (num_rows < 1 || row < 0)) {
    return (uint8_t *)0x0;
  }
  stride = io->width;
  if (dec->is_alpha_decoded_ == 0) {
    pAVar7 = dec->alph_dec_;
    if (pAVar7 == (ALPHDecoder *)0x0) {
      pAVar7 = (ALPHDecoder *)WebPSafeCalloc(1,0xd8);
      dec->alph_dec_ = pAVar7;
      if (pAVar7 == (ALPHDecoder *)0x0) {
        return (uint8_t *)0x0;
      }
      puVar8 = (uint8_t *)WebPSafeMalloc((long)io->crop_bottom * (long)io->width,1);
      dec->alpha_plane_mem_ = puVar8;
      if (puVar8 == (uint8_t *)0x0) goto LAB_00117912;
      dec->alpha_plane_ = puVar8;
      dec->alpha_prev_line_ = (uint8_t *)0x0;
      pAVar7 = dec->alph_dec_;
      pbVar2 = dec->alpha_data_;
      uVar9 = dec->alpha_data_size_;
      VP8FiltersInit();
      pAVar7->output_ = puVar8;
      iVar4 = io->height;
      pAVar7->width_ = io->width;
      pAVar7->height_ = iVar4;
      if (uVar9 < 2) goto LAB_00117912;
      bVar1 = *pbVar2;
      pAVar7->method_ = bVar1 & 3;
      pAVar7->filter_ = *pbVar2 >> 2 & WEBP_FILTER_GRADIENT;
      uVar5 = *pbVar2 >> 4 & 3;
      pAVar7->pre_processing_ = uVar5;
      if (((1 < (byte)(bVar1 & 3)) || (1 < (byte)uVar5)) || (0x3f < *pbVar2)) goto LAB_00117912;
      uVar9 = uVar9 - 1;
      VP8InitIoInternal(&pAVar7->io_,0x209);
      WebPInitCustomIo((WebPDecParams *)0x0,&pAVar7->io_);
      (pAVar7->io_).opaque = pAVar7;
      iVar4 = io->height;
      (pAVar7->io_).width = io->width;
      (pAVar7->io_).height = iVar4;
      iVar4 = io->crop_left;
      iVar13 = io->crop_right;
      iVar3 = io->crop_top;
      (pAVar7->io_).use_cropping = io->use_cropping;
      (pAVar7->io_).crop_left = iVar4;
      (pAVar7->io_).crop_right = iVar13;
      (pAVar7->io_).crop_top = iVar3;
      (pAVar7->io_).crop_bottom = io->crop_bottom;
      if (pAVar7->method_ == 0) {
        uVar5 = (uint)((ulong)((long)pAVar7->height_ * (long)pAVar7->width_) <= uVar9);
      }
      else {
        uVar5 = VP8LDecodeAlphaHeader(pAVar7,pbVar2 + 1,uVar9);
      }
      if (uVar5 == 0) goto LAB_00117912;
      pAVar7 = dec->alph_dec_;
      if (pAVar7->pre_processing_ == 1) {
        num_rows = iVar6 - row;
      }
      else {
        dec->alpha_dithering_ = 0;
      }
    }
    iVar6 = (pAVar7->io_).crop_bottom;
    if (pAVar7->method_ == 0) {
      iVar4 = pAVar7->width_;
      __n = (size_t)iVar4;
      puVar12 = dec->alpha_prev_line_;
      puVar15 = dec->alpha_data_;
      puVar10 = dec->alpha_plane_;
      lVar14 = (long)(iVar4 * row);
      puVar8 = puVar10 + lVar14;
      iVar13 = 0;
      if (0 < num_rows) {
        iVar13 = num_rows;
      }
      if (pAVar7->filter_ == WEBP_FILTER_NONE) {
        while (puVar11 = puVar8, bVar16 = iVar13 != 0, iVar13 = iVar13 + -1, bVar16) {
          memcpy(puVar10 + lVar14,puVar15 + lVar14 + 1,__n);
          lVar14 = lVar14 + __n;
          puVar8 = puVar11 + __n;
          puVar12 = puVar11;
        }
      }
      else {
        puVar15 = puVar15 + lVar14 + 1;
        while (puVar10 = puVar8, bVar16 = iVar13 != 0, iVar13 = iVar13 + -1, bVar16) {
          (*WebPUnfilters[pAVar7->filter_])(puVar12,puVar15,puVar10,iVar4);
          puVar15 = puVar15 + __n;
          puVar8 = puVar10 + __n;
          puVar12 = puVar10;
        }
      }
      dec->alpha_prev_line_ = puVar12;
    }
    else {
      iVar4 = VP8LDecodeAlphaImageStream(pAVar7,num_rows + row);
      if (iVar4 == 0) goto LAB_00117912;
    }
    if (num_rows + row < iVar6) {
      if (dec->is_alpha_decoded_ == 0) goto LAB_00117623;
    }
    else {
      dec->is_alpha_decoded_ = 1;
    }
    ALPHDelete(dec->alph_dec_);
    dec->alph_dec_ = (ALPHDecoder *)0x0;
    if ((0 < dec->alpha_dithering_) &&
       (iVar6 = WebPDequantizeLevels
                          (dec->alpha_plane_ + (long)io->crop_left + (long)(io->crop_top * stride),
                           io->crop_right - io->crop_left,io->crop_bottom - io->crop_top,stride,
                           dec->alpha_dithering_), iVar6 == 0)) {
LAB_00117912:
      WebPDeallocateAlphaMemory(dec);
      return (uint8_t *)0x0;
    }
  }
LAB_00117623:
  return dec->alpha_plane_ + stride * row;
}

Assistant:

const uint8_t* VP8DecompressAlphaRows(VP8Decoder* const dec,
                                      const VP8Io* const io,
                                      int row, int num_rows) {
  const int width = io->width;
  const int height = io->crop_bottom;

  assert(dec != NULL && io != NULL);

  if (row < 0 || num_rows <= 0 || row + num_rows > height) {
    return NULL;
  }

  if (!dec->is_alpha_decoded_) {
    if (dec->alph_dec_ == NULL) {    // Initialize decoder.
      dec->alph_dec_ = ALPHNew();
      if (dec->alph_dec_ == NULL) return NULL;
      if (!AllocateAlphaPlane(dec, io)) goto Error;
      if (!ALPHInit(dec->alph_dec_, dec->alpha_data_, dec->alpha_data_size_,
                    io, dec->alpha_plane_)) {
        goto Error;
      }
      // if we allowed use of alpha dithering, check whether it's needed at all
      if (dec->alph_dec_->pre_processing_ != ALPHA_PREPROCESSED_LEVELS) {
        dec->alpha_dithering_ = 0;   // disable dithering
      } else {
        num_rows = height - row;     // decode everything in one pass
      }
    }

    assert(dec->alph_dec_ != NULL);
    assert(row + num_rows <= height);
    if (!ALPHDecode(dec, row, num_rows)) goto Error;

    if (dec->is_alpha_decoded_) {   // finished?
      ALPHDelete(dec->alph_dec_);
      dec->alph_dec_ = NULL;
      if (dec->alpha_dithering_ > 0) {
        uint8_t* const alpha = dec->alpha_plane_ + io->crop_top * width
                             + io->crop_left;
        if (!WebPDequantizeLevels(alpha,
                                  io->crop_right - io->crop_left,
                                  io->crop_bottom - io->crop_top,
                                  width, dec->alpha_dithering_)) {
          goto Error;
        }
      }
    }
  }

  // Return a pointer to the current decoded row.
  return dec->alpha_plane_ + row * width;

 Error:
  WebPDeallocateAlphaMemory(dec);
  return NULL;
}